

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall
dap::json::JsonCppSerializer::array
          (JsonCppSerializer *this,size_t count,function<bool_(dap::Serializer_*)> *cb)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  JsonCppSerializer s;
  
  Json::Value::Value((Value *)&s,arrayValue);
  Json::Value::operator=(this->json,(Value *)&s);
  Json::Value::~Value((Value *)&s);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (count == uVar3) break;
    s.json = Json::Value::operator[](this->json,(ArrayIndex)uVar3);
    s.super_Serializer._vptr_Serializer = (_func_int **)&PTR__JsonCppSerializer_00abd738;
    s.ownsJson = false;
    s.removed = false;
    bVar2 = std::function<bool_(dap::Serializer_*)>::operator()(cb,&s.super_Serializer);
    ~JsonCppSerializer(&s);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return count <= uVar3;
}

Assistant:

bool JsonCppSerializer::array(size_t count,
                              const std::function<bool(dap::Serializer*)>& cb) {
  *json = Json::Value(Json::arrayValue);
  for (size_t i = 0; i < count; i++) {
    JsonCppSerializer s(&(*json)[Json::Value::ArrayIndex(i)]);
    if (!cb(&s)) {
      return false;
    }
  }
  return true;
}